

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error-formatter.cc
# Opt level: O2

string * wabt::FormatErrorsToString
                   (string *__return_storage_ptr__,Errors *errors,Type location_type,
                   LexerSourceLineFinder *line_finder,Color *color,string *header,
                   PrintHeader print_header,int source_line_max_length)

{
  int iVar1;
  pointer pEVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  char cVar6;
  pointer pEVar7;
  PrintHeader local_cc;
  SourceLine local_98;
  string indent_str;
  string local_50 [32];
  
  local_cc = print_header;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pEVar7 = (errors->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pEVar2 = (errors->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (pEVar7 == pEVar2) {
      return __return_storage_ptr__;
    }
    if (header->_M_string_length == 0) {
      cVar6 = '\0';
    }
    else {
      if (local_cc != Always) {
        cVar6 = '\x02';
        if (local_cc != Once) goto LAB_00153301;
        local_cc = Never;
      }
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      cVar6 = (header->_M_string_length != 0) * '\x02';
    }
LAB_00153301:
    indent_str._M_dataplus._M_p = (pointer)&indent_str.field_2;
    std::__cxx11::string::_M_construct((ulong)&indent_str,cVar6);
    std::__cxx11::string::string(local_50,(string *)&indent_str);
    std::__cxx11::string::append((char *)local_50);
    if ((pEVar7->loc).filename.size_ != 0) {
      string_view::to_string_abi_cxx11_(&local_98.line,&(pEVar7->loc).filename);
      std::__cxx11::string::append(local_50);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::append((char *)local_50);
    }
    if (location_type == Text) {
      StringPrintf_abi_cxx11_
                (&local_98.line,"%d:%d: ",(ulong)(uint)(pEVar7->loc).field_1.field_0.line,
                 (ulong)(uint)(pEVar7->loc).field_1.field_0.first_column);
LAB_001533bf:
      std::__cxx11::string::append(local_50);
      std::__cxx11::string::_M_dispose();
    }
    else if ((pEVar7->loc).field_1.field_1.offset != 0xffffffffffffffff) {
      StringPrintf_abi_cxx11_(&local_98.line,"%07zx: ");
      goto LAB_001533bf;
    }
    std::__cxx11::string::append((char *)local_50);
    if ((pEVar7->error_level != Warning) && (pEVar7->error_level != Error)) {
      abort();
    }
    std::__cxx11::string::append((char *)local_50);
    std::__cxx11::string::append((char *)local_50);
    std::__cxx11::string::append((char *)local_50);
    std::__cxx11::string::append(local_50);
    cVar6 = (char)local_50;
    std::__cxx11::string::push_back(cVar6);
    local_98.line._M_string_length = 0;
    local_98.line._M_dataplus._M_p = (pointer)&local_98.line.field_2;
    local_98.line.field_2._M_local_buf[0] = '\0';
    if ((line_finder != (LexerSourceLineFinder *)0x0) &&
       (LexerSourceLineFinder::GetSourceLine
                  (line_finder,&pEVar7->loc,(long)source_line_max_length,&local_98),
       local_98.line._M_string_length != 0)) {
      std::__cxx11::string::append(local_50);
      std::__cxx11::string::append(local_50);
      std::__cxx11::string::push_back(cVar6);
      std::__cxx11::string::append(local_50);
      iVar1 = (pEVar7->loc).field_1.field_0.first_column;
      iVar3 = ~local_98.column_offset + iVar1;
      uVar4 = (long)(pEVar7->loc).field_1.field_0.last_column - (long)iVar1;
      uVar5 = local_98.line._M_string_length - (long)iVar3;
      if (uVar4 <= uVar5) {
        uVar5 = uVar4;
      }
      std::__cxx11::string::append((ulong)local_50,(char)iVar3);
      std::__cxx11::string::append((char *)local_50);
      std::__cxx11::string::append((char *)local_50);
      std::__cxx11::string::append((ulong)local_50,(char)uVar5 + (uVar5 == 0));
      std::__cxx11::string::append((char *)local_50);
      std::__cxx11::string::push_back(cVar6);
    }
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::_M_dispose();
    pEVar7 = pEVar7 + 1;
  } while( true );
}

Assistant:

std::string FormatErrorsToString(const Errors& errors,
                                 Location::Type location_type,
                                 LexerSourceLineFinder* line_finder,
                                 const Color& color,
                                 const std::string& header,
                                 PrintHeader print_header,
                                 int source_line_max_length) {
  std::string result;
  for (const auto& error : errors) {
    if (!header.empty()) {
      switch (print_header) {
        case PrintHeader::Never:
          break;
        case PrintHeader::Once:
          print_header = PrintHeader::Never;
          // Fallthrough.
        case PrintHeader::Always:
          result += header;
          result += ":\n";
          break;
      }
    }

    int indent = header.empty() ? 0 : 2;

    result += FormatError(error, location_type, color, line_finder,
                          source_line_max_length, indent);
  }
  return result;
}